

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O0

int Abc_TtCofactorPermConfig(word *pTruth,int i,int nWords,int fSwapOnly,int fNaive)

{
  int iVar1;
  int iVar2;
  uint local_44;
  int Config;
  int fComp23;
  int fComp13;
  int fComp12;
  int fComp03;
  int fComp02;
  int fComp01;
  int fNaive_local;
  int fSwapOnly_local;
  int nWords_local;
  int i_local;
  word *pTruth_local;
  
  if (nWords == 1) {
    pTruth_local._4_4_ = Abc_Tt6CofactorPermNaive(pTruth,i,fSwapOnly);
  }
  else if (fNaive == 0) {
    if (fSwapOnly == 0) {
      local_44 = 0;
      iVar1 = Abc_TtCompare2VarCofsRev(pTruth,nWords,i,0,1);
      iVar2 = Abc_TtCompare2VarCofsRev(pTruth,nWords,i,2,3);
      if (iVar2 < 0) {
        if (iVar1 < 0) {
          iVar1 = Abc_TtCompare2VarCofsRev(pTruth,nWords,i,0,2);
          if (iVar1 == -1) {
            Abc_TtFlip(pTruth,nWords,i);
            Abc_TtFlip(pTruth,nWords,i + 1);
            local_44 = 3;
          }
          else if (iVar1 == 0) {
            iVar1 = Abc_TtCompare2VarCofsRev(pTruth,nWords,i,1,3);
            if (iVar1 < 0) {
              Abc_TtFlip(pTruth,nWords,i);
              Abc_TtFlip(pTruth,nWords,i + 1);
              local_44 = 3;
            }
            else {
              Abc_TtFlip(pTruth,nWords,i);
              local_44 = 1;
            }
          }
          else {
            Abc_TtFlip(pTruth,nWords,i);
            local_44 = 1;
          }
        }
        else {
          iVar2 = Abc_TtCompare2VarCofsRev(pTruth,nWords,i,1,2);
          if (iVar2 < 1) {
            if (iVar2 == 0) {
              Abc_TtFlip(pTruth,nWords,i);
              Abc_TtFlip(pTruth,nWords,i + 1);
              local_44 = 3;
            }
            else {
              Abc_TtFlip(pTruth,nWords,i + 1);
              local_44 = 2;
              if (iVar1 == 0) {
                Abc_TtFlip(pTruth,nWords,i);
                local_44 = 3;
              }
            }
          }
          else {
            Abc_TtFlip(pTruth,nWords,i);
            local_44 = 1;
          }
        }
      }
      else if (iVar1 < 0) {
        iVar1 = Abc_TtCompare2VarCofsRev(pTruth,nWords,i,0,3);
        if (iVar1 < 0) {
          Abc_TtFlip(pTruth,nWords,i);
          Abc_TtFlip(pTruth,nWords,i + 1);
          local_44 = 3;
        }
        else {
          if (iVar2 == 0) {
            Abc_TtFlip(pTruth,nWords,i);
          }
          local_44 = (uint)(iVar2 == 0);
        }
      }
      else {
        iVar1 = Abc_TtCompare2VarCofsRev(pTruth,nWords,i,1,3);
        if (iVar1 < 0) {
          Abc_TtFlip(pTruth,nWords,i + 1);
          local_44 = 2;
        }
        else if ((iVar1 == 0) && (iVar1 = Abc_TtCompare2VarCofsRev(pTruth,nWords,i,0,2), iVar1 < 0))
        {
          Abc_TtFlip(pTruth,nWords,i + 1);
          local_44 = 2;
        }
      }
      iVar1 = Abc_TtCompare2VarCofsRev(pTruth,nWords,i,1,2);
      if (iVar1 < 0) {
        Abc_TtSwapAdjacent(pTruth,nWords,i);
        local_44 = local_44 ^ 4;
      }
      pTruth_local._4_4_ = local_44;
    }
    else {
      iVar1 = Abc_TtCompare2VarCofsRev(pTruth,nWords,i,1,2);
      if (iVar1 < 0) {
        Abc_TtSwapAdjacent(pTruth,nWords,i);
        pTruth_local._4_4_ = 4;
      }
      else {
        pTruth_local._4_4_ = 0;
      }
    }
  }
  else {
    pTruth_local._4_4_ = Abc_TtCofactorPermNaive(pTruth,i,nWords,fSwapOnly);
  }
  return pTruth_local._4_4_;
}

Assistant:

int Abc_TtCofactorPermConfig( word * pTruth, int i, int nWords, int fSwapOnly, int fNaive )
{
    if ( nWords == 1 )
        return Abc_Tt6CofactorPermNaive( pTruth, i, fSwapOnly );
    if ( fNaive )
        return Abc_TtCofactorPermNaive( pTruth, i, nWords, fSwapOnly );
    if ( fSwapOnly )
    {
        if ( Abc_TtCompare2VarCofsRev( pTruth, nWords, i, 1, 2 ) < 0 ) // Cof1 < Cof2
        {
            Abc_TtSwapAdjacent( pTruth, nWords, i );
            return 4;
        }
        return 0;
    }
    {  
        int fComp01, fComp02, fComp03, fComp12, fComp13, fComp23, Config = 0;
        fComp01 = Abc_TtCompare2VarCofsRev( pTruth, nWords, i, 0, 1 );
        fComp23 = Abc_TtCompare2VarCofsRev( pTruth, nWords, i, 2, 3 );
        if ( fComp23 >= 0 ) // Cof2 >= Cof3 
        {
            if ( fComp01 >= 0 ) // Cof0 >= Cof1
            {
                fComp13 = Abc_TtCompare2VarCofsRev( pTruth, nWords, i, 1, 3 );
                if ( fComp13 < 0 ) // Cof1 < Cof3 
                    Abc_TtFlip( pTruth, nWords, i + 1 ), Config = 2;
                else if ( fComp13 == 0 ) // Cof1 == Cof3 
                {
                    fComp02 = Abc_TtCompare2VarCofsRev( pTruth, nWords, i, 0, 2 );
                    if ( fComp02 < 0 )
                        Abc_TtFlip( pTruth, nWords, i + 1 ), Config = 2;
                }
                // else   Cof1 > Cof3 -- do nothing
            }
            else // Cof0 < Cof1
            {
                fComp03 = Abc_TtCompare2VarCofsRev( pTruth, nWords, i, 0, 3 );
                if ( fComp03 < 0 ) // Cof0 < Cof3
                {
                    Abc_TtFlip( pTruth, nWords, i );
                    Abc_TtFlip( pTruth, nWords, i + 1 ), Config = 3;
                }
                else //  Cof0 >= Cof3
                {
                    if ( fComp23 == 0 ) // can flip Cof0 and Cof1
                        Abc_TtFlip( pTruth, nWords, i ), Config = 1;
                }
            }
        }
        else // Cof2 < Cof3 
        {
            if ( fComp01 >= 0 ) // Cof0 >= Cof1
            {
                fComp12 = Abc_TtCompare2VarCofsRev( pTruth, nWords, i, 1, 2 );
                if ( fComp12 > 0 ) // Cof1 > Cof2 
                    Abc_TtFlip( pTruth, nWords, i ), Config = 1;
                else if ( fComp12 == 0 ) // Cof1 == Cof2 
                {
                    Abc_TtFlip( pTruth, nWords, i );
                    Abc_TtFlip( pTruth, nWords, i + 1 ), Config = 3;
                }
                else // Cof1 < Cof2
                {
                    Abc_TtFlip( pTruth, nWords, i + 1 ), Config = 2;
                    if ( fComp01 == 0 )
                        Abc_TtFlip( pTruth, nWords, i ), Config ^= 1;
                }
            }
            else // Cof0 < Cof1
            {
                fComp02 = Abc_TtCompare2VarCofsRev( pTruth, nWords, i, 0, 2 );
                if ( fComp02 == -1 ) // Cof0 < Cof2 
                {
                    Abc_TtFlip( pTruth, nWords, i );
                    Abc_TtFlip( pTruth, nWords, i + 1 ), Config = 3;
                }
                else if ( fComp02 == 0 ) // Cof0 == Cof2
                {
                    fComp13 = Abc_TtCompare2VarCofsRev( pTruth, nWords, i, 1, 3 );
                    if ( fComp13 >= 0 ) // Cof1 >= Cof3 
                        Abc_TtFlip( pTruth, nWords, i ), Config = 1;
                    else // Cof1 < Cof3 
                    {
                        Abc_TtFlip( pTruth, nWords, i );
                        Abc_TtFlip( pTruth, nWords, i + 1 ), Config = 3;
                    }
                }
                else // Cof0 > Cof2
                    Abc_TtFlip( pTruth, nWords, i ), Config = 1;
            }
        }
        // perform final swap if needed
        fComp12 = Abc_TtCompare2VarCofsRev( pTruth, nWords, i, 1, 2 );
        if ( fComp12 < 0 ) // Cof1 < Cof2
            Abc_TtSwapAdjacent( pTruth, nWords, i ), Config ^= 4;
        return Config;
    }
}